

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O1

string * __thiscall
calculator::Number::toString_abi_cxx11_(string *__return_storage_ptr__,Number *this)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  string *__str;
  uint __len;
  ulong __val;
  
  uVar1 = this->__value;
  __val = -uVar1;
  if (0 < (long)uVar1) {
    __val = uVar1;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = __val;
    uVar3 = 4;
    do {
      __len = uVar3;
      if (uVar4 < 100) {
        __len = __len - 2;
        goto LAB_0010f0b5;
      }
      if (uVar4 < 1000) {
        __len = __len - 1;
        goto LAB_0010f0b5;
      }
      if (uVar4 < 10000) goto LAB_0010f0b5;
      bVar2 = 99999 < uVar4;
      uVar4 = uVar4 / 10000;
      uVar3 = __len + 4;
    } while (bVar2);
    __len = __len + 1;
  }
LAB_0010f0b5:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct
            ((ulong)__return_storage_ptr__,(char)__len - (char)((long)uVar1 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar1 >> 0x3f),__len,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() { return std::to_string(__value); }